

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::_InternalSerialize
          (TestNestedMessageHasBits_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int *piVar1;
  int iVar2;
  uint8_t *puVar3;
  const_pointer piVar4;
  byte *pbVar5;
  ulong uVar6;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>_> *value;
  uint uVar7;
  int index;
  LogMessageFatal local_40;
  
  uVar7 = *(uint *)((long)&this->field_0 + 0x10);
  if (0 < (int)uVar7) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar3) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    *puVar3 = '\n';
    target = puVar3 + 2;
    for (; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-1] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar7;
    piVar4 = google::protobuf::RepeatedField<int>::data
                       (&(this->field_0)._impl_.nestedmessage_repeated_int32_);
    iVar2 = google::protobuf::RepeatedField<int>::size
                      (&(this->field_0)._impl_.nestedmessage_repeated_int32_);
    piVar1 = piVar4 + iVar2;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar6 = (ulong)*piVar4; target = pbVar5 + 1, 0x7f < uVar6; uVar6 = uVar6 >> 7) {
        *pbVar5 = (byte)uVar6 | 0x80;
        pbVar5 = target;
      }
      piVar4 = piVar4 + 1;
      *pbVar5 = (byte)uVar6;
    } while (piVar4 < piVar1);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x20);
  for (index = 0; iVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
                      (&(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_.
                        super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageHasBits_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 nestedmessage_repeated_int32 = 1;
  {
    int byte_size = this_._impl_._nestedmessage_repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_nestedmessage_repeated_int32(), byte_size, target);
    }
  }

  // repeated .edition_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nestedmessage_repeated_foreignmessage_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nestedmessage_repeated_foreignmessage().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  return target;
}